

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

stbi_uc stbi__get_marker(stbi__jpeg *j)

{
  stbi__context *psVar1;
  stbi_uc sVar2;
  stbi_uc sVar3;
  stbi_uc *psVar4;
  
  sVar3 = j->marker;
  if (sVar3 != 0xff) {
    j->marker = 0xff;
    return sVar3;
  }
  psVar1 = j->s;
  psVar4 = psVar1->img_buffer;
  if (psVar1->img_buffer_end <= psVar4) {
    if (psVar1->read_from_callbacks == 0) {
      return 0xff;
    }
    stbi__refill_buffer(psVar1);
    psVar4 = psVar1->img_buffer;
  }
  psVar1->img_buffer = psVar4 + 1;
  sVar3 = 0xff;
  sVar2 = *psVar4;
  do {
    while( true ) {
      if (sVar2 != 0xff) {
        return sVar3;
      }
      psVar1 = j->s;
      psVar4 = psVar1->img_buffer;
      if (psVar1->img_buffer_end <= psVar4) break;
LAB_0012b08f:
      psVar1->img_buffer = psVar4 + 1;
      sVar3 = *psVar4;
      sVar2 = sVar3;
    }
    if (psVar1->read_from_callbacks != 0) {
      stbi__refill_buffer(psVar1);
      psVar4 = psVar1->img_buffer;
      goto LAB_0012b08f;
    }
    sVar3 = '\0';
    sVar2 = sVar3;
  } while( true );
}

Assistant:

static stbi_uc stbi__get_marker(stbi__jpeg *j)
{
   stbi_uc x;
   if (j->marker != STBI__MARKER_none) { x = j->marker; j->marker = STBI__MARKER_none; return x; }
   x = stbi__get8(j->s);
   if (x != 0xff) return STBI__MARKER_none;
   while (x == 0xff)
      x = stbi__get8(j->s); // consume repeated 0xff fill bytes
   return x;
}